

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O1

Value * __thiscall
minja::MethodCallExpr::do_evaluate
          (Value *__return_storage_ptr__,MethodCallExpr *this,shared_ptr<minja::Context> *context)

{
  _Atomic_word *p_Var1;
  int *piVar2;
  Expression *this_00;
  element_type *peVar3;
  pointer pcVar4;
  object_t *poVar5;
  long lVar6;
  long lVar7;
  undefined8 uVar8;
  bool bVar9;
  undefined1 uVar10;
  int iVar11;
  size_t index;
  size_t sVar12;
  Value *pVVar13;
  Value *pVVar14;
  runtime_error *prVar15;
  long *plVar16;
  size_type *psVar17;
  element_type *peVar18;
  string *v;
  data *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var19;
  long lVar20;
  initializer_list<minja::Value> __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> sep;
  Value callable;
  ArgumentsValue vargs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  Value obj;
  undefined1 local_238 [32];
  undefined1 local_218 [32];
  element_type *local_1f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1f0;
  element_type *local_1e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1e0;
  data local_1d8;
  Value local_1c8;
  ArgumentsValue local_178;
  undefined1 local_148 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_120;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_110;
  data local_108;
  undefined1 local_f8 [32];
  Value local_d8;
  Value *local_88;
  vector<minja::Value,_std::allocator<minja::Value>_> local_80;
  vector<minja::Value,_std::allocator<minja::Value>_> local_68;
  vector<minja::Value,_std::allocator<minja::Value>_> local_48;
  
  this_00 = (this->object).super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 == (Expression *)0x0) {
    prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar15,"MethodCallExpr.object is null");
LAB_001ee1ab:
    __cxa_throw(prVar15,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((this->method).super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar15,"MethodCallExpr.method is null");
    goto LAB_001ee1ab;
  }
  Expression::evaluate(&local_d8,this_00,context);
  ArgumentsExpression::evaluate(&local_178,&this->args,context);
  if ((((local_d8.object_.
         super___shared_ptr<nlohmann::json_abi_v3_11_3::ordered_map<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value,_std::less<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value>_>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr == (element_type *)0x0) &&
       (local_d8.array_.
        super___shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr == (element_type *)0x0)) && (local_d8.primitive_.m_data.m_type == null)) &&
     (local_d8.callable_.
      super___shared_ptr<std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr == (element_type *)0x0)) {
    prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
    peVar3 = (this->method).super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    local_238._0_8_ = local_238 + 0x10;
    pcVar4 = (peVar3->name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_238,pcVar4,pcVar4 + (peVar3->name)._M_string_length);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
                   "Trying to call method \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238);
    plVar16 = (long *)std::__cxx11::string::append(local_148);
    local_218._0_8_ = *plVar16;
    psVar17 = (size_type *)(plVar16 + 2);
    if ((size_type *)local_218._0_8_ == psVar17) {
      local_218._16_8_ = *psVar17;
      local_218._24_8_ = plVar16[3];
      local_218._0_8_ = local_218 + 0x10;
    }
    else {
      local_218._16_8_ = *psVar17;
    }
    local_218._8_8_ = plVar16[1];
    *plVar16 = (long)psVar17;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    std::runtime_error::runtime_error(prVar15,(string *)local_218);
    __cxa_throw(prVar15,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_d8.array_.
      super___shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0) {
    peVar3 = (this->method).super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    pVVar13 = (Value *)(local_218 + 0x10);
    pcVar4 = (peVar3->name)._M_dataplus._M_p;
    local_218._0_8_ = pVVar13;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_218,pcVar4,pcVar4 + (peVar3->name)._M_string_length);
    iVar11 = std::__cxx11::string::compare(local_218);
    if ((Value *)local_218._0_8_ != pVVar13) {
      operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
    }
    if (iVar11 == 0) {
      local_218._0_8_ = pVVar13;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"append method","");
      local_148._0_8_ = (element_type *)0x1;
      local_148._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
      local_238._0_8_ = (Value *)0x0;
      local_238._8_8_ = (Value *)0x0;
      ArgumentsValue::expectArgs
                (&local_178,(string *)local_218,(pair<unsigned_long,_unsigned_long> *)local_148,
                 (pair<unsigned_long,_unsigned_long> *)local_238);
      if ((Value *)local_218._0_8_ != pVVar13) {
        operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
      }
      Value::push_back(&local_d8,
                       local_178.args.
                       super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
                       super__Vector_impl_data._M_start);
    }
    else {
      peVar3 = (this->method).super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      pcVar4 = (peVar3->name)._M_dataplus._M_p;
      local_218._0_8_ = pVVar13;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_218,pcVar4,pcVar4 + (peVar3->name)._M_string_length);
      iVar11 = std::__cxx11::string::compare(local_218);
      if ((Value *)local_218._0_8_ != pVVar13) {
        operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
      }
      if (iVar11 == 0) {
        local_218._0_8_ = pVVar13;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"pop method","");
        local_148._0_8_ = (element_type *)0x0;
        local_148._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
        local_238._0_8_ = (Value *)0x0;
        local_238._8_8_ = (Value *)0x0;
        ArgumentsValue::expectArgs
                  (&local_178,(string *)local_218,(pair<unsigned_long,_unsigned_long> *)local_148,
                   (pair<unsigned_long,_unsigned_long> *)local_238);
        if ((Value *)local_218._0_8_ != pVVar13) {
          operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
        }
        if (local_178.args.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
            super__Vector_impl_data._M_start ==
            local_178.args.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          local_1d8.m_value.object = (object_t *)0x0;
          local_218._0_8_ = (Value *)0x0;
          local_218._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_218._16_8_ = 0;
          local_218._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_1f8 = (element_type *)0x0;
          _Stack_1f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_1e8 = (element_type *)0x0;
          _Stack_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_1d8.m_type = null;
          nlohmann::json_abi_v3_11_3::
          basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::assert_invariant((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                              *)&local_1d8,true);
          nlohmann::json_abi_v3_11_3::
          basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::assert_invariant((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                              *)&local_1d8,true);
        }
        else {
          Value::Value((Value *)local_218,
                       local_178.args.
                       super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
                       super__Vector_impl_data._M_start);
        }
        Value::pop(__return_storage_ptr__,&local_d8,(Value *)local_218);
        goto LAB_001ededd;
      }
      peVar3 = (this->method).super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      pcVar4 = (peVar3->name)._M_dataplus._M_p;
      local_218._0_8_ = pVVar13;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_218,pcVar4,pcVar4 + (peVar3->name)._M_string_length);
      iVar11 = std::__cxx11::string::compare(local_218);
      if ((Value *)local_218._0_8_ != pVVar13) {
        operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
      }
      if (iVar11 != 0) goto LAB_001ee374;
      local_218._0_8_ = pVVar13;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"insert method","");
      local_148._0_8_ = (element_type *)0x2;
      local_148._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2;
      local_238._0_8_ = (Value *)0x0;
      local_238._8_8_ = (Value *)0x0;
      ArgumentsValue::expectArgs
                (&local_178,(string *)local_218,(pair<unsigned_long,_unsigned_long> *)local_148,
                 (pair<unsigned_long,_unsigned_long> *)local_238);
      if ((Value *)local_218._0_8_ != pVVar13) {
        operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
      }
      index = Value::get<long>(local_178.args.
                               super__Vector_base<minja::Value,_std::allocator<minja::Value>_>.
                               _M_impl.super__Vector_impl_data._M_start);
      if (((long)index < 0) || (sVar12 = Value::size(&local_d8), (long)sVar12 < (long)index)) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar15,"Index out of range for insert method");
        __cxa_throw(prVar15,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      Value::insert(&local_d8,index,
                    local_178.args.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>.
                    _M_impl.super__Vector_impl_data._M_start + 1);
    }
    (__return_storage_ptr__->primitive_).m_data.m_value.object = (object_t *)0x0;
    (__return_storage_ptr__->super_enable_shared_from_this<minja::Value>)._M_weak_this.
    super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    (__return_storage_ptr__->super_enable_shared_from_this<minja::Value>)._M_weak_this.
    super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->array_).
    super___shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    (__return_storage_ptr__->array_).
    super___shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->object_).
    super___shared_ptr<nlohmann::json_abi_v3_11_3::ordered_map<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value,_std::less<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    (__return_storage_ptr__->object_).
    super___shared_ptr<nlohmann::json_abi_v3_11_3::ordered_map<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value,_std::less<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->callable_).
    super___shared_ptr<std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    (__return_storage_ptr__->callable_).
    super___shared_ptr<std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->primitive_).m_data.m_type = null;
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::assert_invariant(&__return_storage_ptr__->primitive_,true);
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::assert_invariant(&__return_storage_ptr__->primitive_,true);
    goto LAB_001ed1de;
  }
  if (local_d8.object_.
      super___shared_ptr<nlohmann::json_abi_v3_11_3::ordered_map<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value,_std::less<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0) {
    peVar3 = (this->method).super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    pVVar13 = (Value *)(local_218 + 0x10);
    pcVar4 = (peVar3->name)._M_dataplus._M_p;
    local_218._0_8_ = pVVar13;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_218,pcVar4,pcVar4 + (peVar3->name)._M_string_length);
    iVar11 = std::__cxx11::string::compare(local_218);
    if ((Value *)local_218._0_8_ != pVVar13) {
      operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
    }
    if (iVar11 == 0) {
      local_218._0_8_ = pVVar13;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"items method","");
      local_148._0_8_ = (element_type *)0x0;
      local_148._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_238._0_8_ = (Value *)0x0;
      local_238._8_8_ = (Value *)0x0;
      ArgumentsValue::expectArgs
                (&local_178,(string *)local_218,(pair<unsigned_long,_unsigned_long> *)local_148,
                 (pair<unsigned_long,_unsigned_long> *)local_238);
      if ((Value *)local_218._0_8_ != pVVar13) {
        operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
      }
      local_48.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Value::array(__return_storage_ptr__,&local_48);
      std::vector<minja::Value,_std::allocator<minja::Value>_>::~vector(&local_48);
      Value::keys((vector<minja::Value,_std::allocator<minja::Value>_> *)local_238,&local_d8);
      local_88 = (Value *)local_238._8_8_;
      if (local_238._0_8_ != local_238._8_8_) {
        pVVar13 = (Value *)local_238._0_8_;
        do {
          Value::Value((Value *)local_218,pVVar13);
          pVVar14 = Value::at(&local_d8,pVVar13);
          Value::Value(&local_1c8,pVVar14);
          __l._M_len = 2;
          __l._M_array = (Value *)local_218;
          std::vector<minja::Value,_std::allocator<minja::Value>_>::vector
                    (&local_80,__l,(allocator_type *)local_f8);
          Value::array((Value *)local_148,&local_80);
          Value::push_back(__return_storage_ptr__,(Value *)local_148);
          nlohmann::json_abi_v3_11_3::
          basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::assert_invariant((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                              *)&local_108,false);
          nlohmann::json_abi_v3_11_3::
          basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_108);
          if (local_110._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_110._M_pi);
          }
          if (local_120._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_120._M_pi);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._24_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._24_8_);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var1 = (_Atomic_word *)(local_148._8_8_ + 0xc);
              iVar11 = *p_Var1;
              *p_Var1 = *p_Var1 + -1;
              UNLOCK();
            }
            else {
              iVar11 = *(_Atomic_word *)(local_148._8_8_ + 0xc);
              *(int *)(local_148._8_8_ + 0xc) = iVar11 + -1;
            }
            if (iVar11 == 1) {
              (*(*(_func_int ***)local_148._8_8_)[3])();
            }
          }
          std::vector<minja::Value,_std::allocator<minja::Value>_>::~vector(&local_80);
          lVar20 = -0xa0;
          this_01 = &local_1c8.primitive_.m_data;
          do {
            nlohmann::json_abi_v3_11_3::
            basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::assert_invariant((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                *)this_01,false);
            nlohmann::json_abi_v3_11_3::
            basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data(this_01);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01[-1].m_value.object !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01[-1].m_value.object)
              ;
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01[-2].m_value.object !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01[-2].m_value.object)
              ;
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01[-3].m_value.object !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01[-3].m_value.object)
              ;
            }
            poVar5 = this_01[-4].m_value.object;
            if (poVar5 != (object_t *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                piVar2 = (int *)((long)&(poVar5->
                                        super_vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                                        ).
                                        super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish + 4);
                iVar11 = *piVar2;
                *piVar2 = *piVar2 + -1;
                UNLOCK();
              }
              else {
                iVar11 = *(int *)((long)&(poVar5->
                                         super_vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                                         ).
                                         super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish + 4);
                *(int *)((long)&(poVar5->
                                super_vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                                ).
                                super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish + 4) = iVar11 + -1;
              }
              if (iVar11 == 1) {
                (**(code **)((long)&(((poVar5->
                                      super_vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                                      ).
                                      super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->first).field_2 + 8
                            ))();
              }
            }
            this_01 = this_01 + -5;
            lVar20 = lVar20 + 0x50;
          } while (lVar20 != 0);
          pVVar13 = pVVar13 + 1;
        } while (pVVar13 != local_88);
      }
      std::vector<minja::Value,_std::allocator<minja::Value>_>::~vector
                ((vector<minja::Value,_std::allocator<minja::Value>_> *)local_238);
      goto LAB_001ed1de;
    }
    peVar3 = (this->method).super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    pcVar4 = (peVar3->name)._M_dataplus._M_p;
    local_218._0_8_ = pVVar13;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_218,pcVar4,pcVar4 + (peVar3->name)._M_string_length);
    iVar11 = std::__cxx11::string::compare(local_218);
    if ((Value *)local_218._0_8_ != pVVar13) {
      operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
    }
    if (iVar11 == 0) {
      local_218._0_8_ = pVVar13;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"pop method","");
      local_148._0_8_ = (element_type *)0x1;
      local_148._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
      local_238._0_8_ = (Value *)0x0;
      local_238._8_8_ = (Value *)0x0;
      ArgumentsValue::expectArgs
                (&local_178,(string *)local_218,(pair<unsigned_long,_unsigned_long> *)local_148,
                 (pair<unsigned_long,_unsigned_long> *)local_238);
      if ((Value *)local_218._0_8_ != pVVar13) {
        operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
      }
      Value::pop(__return_storage_ptr__,&local_d8,
                 local_178.args.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      goto LAB_001ed1de;
    }
    peVar3 = (this->method).super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    pcVar4 = (peVar3->name)._M_dataplus._M_p;
    local_218._0_8_ = pVVar13;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_218,pcVar4,pcVar4 + (peVar3->name)._M_string_length);
    iVar11 = std::__cxx11::string::compare(local_218);
    if ((Value *)local_218._0_8_ != pVVar13) {
      operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
    }
    if (iVar11 == 0) {
      local_218._0_8_ = pVVar13;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"get method","");
      local_148._0_8_ = (element_type *)0x1;
      local_148._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2;
      local_238._0_8_ = (Value *)0x0;
      local_238._8_8_ = (Value *)0x0;
      ArgumentsValue::expectArgs
                (&local_178,(string *)local_218,(pair<unsigned_long,_unsigned_long> *)local_148,
                 (pair<unsigned_long,_unsigned_long> *)local_238);
      if ((Value *)local_218._0_8_ != pVVar13) {
        operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
      }
      Value::Value((Value *)local_218,
                   local_178.args.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>.
                   _M_impl.super__Vector_impl_data._M_start);
      if ((long)local_178.args.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_178.args.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>.
                _M_impl.super__Vector_impl_data._M_start == 0x50) {
        bVar9 = Value::contains(&local_d8,(Value *)local_218);
        if (!bVar9) {
          Value::Value(__return_storage_ptr__);
          goto LAB_001ededd;
        }
LAB_001edc68:
        pVVar13 = Value::at(&local_d8,(Value *)local_218);
      }
      else {
        bVar9 = Value::contains(&local_d8,(Value *)local_218);
        if (bVar9) goto LAB_001edc68;
        pVVar13 = local_178.args.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>.
                  _M_impl.super__Vector_impl_data._M_start + 1;
      }
      Value::Value(__return_storage_ptr__,pVVar13);
    }
    else {
      peVar3 = (this->method).super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      pcVar4 = (peVar3->name)._M_dataplus._M_p;
      local_218._0_8_ = pVVar13;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_218,pcVar4,pcVar4 + (peVar3->name)._M_string_length);
      bVar9 = Value::contains(&local_d8,(string *)local_218);
      if ((Value *)local_218._0_8_ != pVVar13) {
        operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
      }
      if (!bVar9) goto LAB_001ee374;
      peVar3 = (this->method).super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      pcVar4 = (peVar3->name)._M_dataplus._M_p;
      local_238._0_8_ = (Value *)(local_238 + 0x10);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_238,pcVar4,pcVar4 + (peVar3->name)._M_string_length);
      Value::Value((Value *)local_148,(string *)local_238);
      pVVar13 = Value::at(&local_d8,(Value *)local_148);
      Value::Value((Value *)local_218,pVVar13);
      nlohmann::json_abi_v3_11_3::
      basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::assert_invariant((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)&local_108,false);
      nlohmann::json_abi_v3_11_3::
      basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_108);
      if (local_110._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_110._M_pi);
      }
      if (local_120._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_120._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._24_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._24_8_);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = (_Atomic_word *)(local_148._8_8_ + 0xc);
          iVar11 = *p_Var1;
          *p_Var1 = *p_Var1 + -1;
          UNLOCK();
        }
        else {
          iVar11 = *(_Atomic_word *)(local_148._8_8_ + 0xc);
          *(int *)(local_148._8_8_ + 0xc) = iVar11 + -1;
        }
        if (iVar11 == 1) {
          (*(*(_func_int ***)local_148._8_8_)[3])();
        }
      }
      if ((Value *)local_238._0_8_ != (Value *)(local_238 + 0x10)) {
        operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
      }
      if (local_1e8 == (element_type *)0x0) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
        peVar3 = (this->method).super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        local_f8._0_8_ = local_f8 + 0x10;
        pcVar4 = (peVar3->name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_f8,pcVar4,pcVar4 + (peVar3->name)._M_string_length);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_238,"Property \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8
                      );
        plVar16 = (long *)std::__cxx11::string::append(local_238);
        local_148._0_8_ = *plVar16;
        peVar18 = (element_type *)(plVar16 + 2);
        if ((element_type *)local_148._0_8_ == peVar18) {
          local_148._16_8_ =
               (peVar18->super_enable_shared_from_this<minja::Value>)._M_weak_this.
               super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_148._24_8_ = plVar16[3];
          local_148._0_8_ = (element_type *)(local_148 + 0x10);
        }
        else {
          local_148._16_8_ =
               (peVar18->super_enable_shared_from_this<minja::Value>)._M_weak_this.
               super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        }
        local_148._8_8_ = plVar16[1];
        *plVar16 = (long)peVar18;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        std::runtime_error::runtime_error(prVar15,(string *)local_148);
        __cxa_throw(prVar15,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      Value::call(__return_storage_ptr__,(Value *)local_218,context,&local_178);
    }
LAB_001ededd:
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::assert_invariant((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_1d8,false);
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_1d8);
    if (_Stack_1e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1e0._M_pi);
    }
    if (_Stack_1f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1f0._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._24_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._24_8_);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = (_Atomic_word *)(local_218._8_8_ + 0xc);
        iVar11 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar11 = *(_Atomic_word *)(local_218._8_8_ + 0xc);
        *(int *)(local_218._8_8_ + 0xc) = iVar11 + -1;
      }
      if (iVar11 == 1) {
        (*(*(_func_int ***)local_218._8_8_)[3])();
      }
    }
    goto LAB_001ed1de;
  }
  if (local_d8.primitive_.m_data.m_type != string) {
LAB_001ee374:
    prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
    peVar3 = (this->method).super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    local_148._0_8_ = local_148 + 0x10;
    pcVar4 = (peVar3->name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_148,pcVar4,pcVar4 + (peVar3->name)._M_string_length);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218,
                   "Unknown method: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148);
    std::runtime_error::runtime_error(prVar15,(string *)local_218);
    __cxa_throw(prVar15,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  Value::get<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
             &local_d8);
  peVar3 = (this->method).super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  pVVar13 = (Value *)(local_218 + 0x10);
  pcVar4 = (peVar3->name)._M_dataplus._M_p;
  local_218._0_8_ = pVVar13;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_218,pcVar4,pcVar4 + (peVar3->name)._M_string_length);
  iVar11 = std::__cxx11::string::compare(local_218);
  if ((Value *)local_218._0_8_ != pVVar13) {
    operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
  }
  if (iVar11 == 0) {
    local_218._0_8_ = pVVar13;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"strip method","");
    local_238._0_8_ = (Value *)0x0;
    local_238._8_8_ = (Value *)0x1;
    local_f8._0_8_ = (string *)0x0;
    local_f8._8_8_ = (string *)0x0;
    ArgumentsValue::expectArgs
              (&local_178,(string *)local_218,(pair<unsigned_long,_unsigned_long> *)local_238,
               (pair<unsigned_long,_unsigned_long> *)local_f8);
    if ((Value *)local_218._0_8_ != pVVar13) {
      operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
    }
    if (local_178.args.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_178.args.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_218._0_8_ = pVVar13;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"");
    }
    else {
      Value::get<std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218,
                 local_178.args.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>.
                 _M_impl.super__Vector_impl_data._M_start);
    }
    strip((string *)local_238,(string *)local_148,(string *)local_218,true,true);
    Value::Value(__return_storage_ptr__,(string *)local_238);
LAB_001ee025:
    if ((Value *)local_238._0_8_ != (Value *)(local_238 + 0x10)) {
      operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
    }
LAB_001ee040:
    local_238._16_8_ = local_218._16_8_;
    pVVar14 = (Value *)local_218._0_8_;
    if ((Value *)local_218._0_8_ != pVVar13) {
LAB_001ee04f:
      operator_delete(pVVar14,local_238._16_8_ + 1);
    }
  }
  else {
    peVar3 = (this->method).super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    pcVar4 = (peVar3->name)._M_dataplus._M_p;
    local_218._0_8_ = pVVar13;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_218,pcVar4,pcVar4 + (peVar3->name)._M_string_length);
    iVar11 = std::__cxx11::string::compare(local_218);
    if ((Value *)local_218._0_8_ != pVVar13) {
      operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
    }
    if (iVar11 == 0) {
      local_218._0_8_ = pVVar13;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"lstrip method","");
      local_238._0_8_ = (Value *)0x0;
      local_238._8_8_ = (Value *)0x1;
      local_f8._0_8_ = (string *)0x0;
      local_f8._8_8_ = (string *)0x0;
      ArgumentsValue::expectArgs
                (&local_178,(string *)local_218,(pair<unsigned_long,_unsigned_long> *)local_238,
                 (pair<unsigned_long,_unsigned_long> *)local_f8);
      if ((Value *)local_218._0_8_ != pVVar13) {
        operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
      }
      if (local_178.args.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_178.args.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        local_218._0_8_ = pVVar13;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"");
      }
      else {
        Value::get<std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218,
                   local_178.args.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>.
                   _M_impl.super__Vector_impl_data._M_start);
      }
      strip((string *)local_238,(string *)local_148,(string *)local_218,true,false);
      Value::Value(__return_storage_ptr__,(string *)local_238);
      goto LAB_001ee025;
    }
    peVar3 = (this->method).super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    pcVar4 = (peVar3->name)._M_dataplus._M_p;
    local_218._0_8_ = pVVar13;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_218,pcVar4,pcVar4 + (peVar3->name)._M_string_length);
    iVar11 = std::__cxx11::string::compare(local_218);
    if ((Value *)local_218._0_8_ != pVVar13) {
      operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
    }
    if (iVar11 == 0) {
      local_218._0_8_ = pVVar13;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"rstrip method","");
      local_238._0_8_ = (Value *)0x0;
      local_238._8_8_ = (Value *)0x1;
      local_f8._0_8_ = (string *)0x0;
      local_f8._8_8_ = (string *)0x0;
      ArgumentsValue::expectArgs
                (&local_178,(string *)local_218,(pair<unsigned_long,_unsigned_long> *)local_238,
                 (pair<unsigned_long,_unsigned_long> *)local_f8);
      if ((Value *)local_218._0_8_ != pVVar13) {
        operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
      }
      if (local_178.args.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_178.args.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        local_218._0_8_ = pVVar13;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"");
      }
      else {
        Value::get<std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218,
                   local_178.args.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>.
                   _M_impl.super__Vector_impl_data._M_start);
      }
      strip((string *)local_238,(string *)local_148,(string *)local_218,false,true);
      Value::Value(__return_storage_ptr__,(string *)local_238);
      goto LAB_001ee025;
    }
    peVar3 = (this->method).super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    pcVar4 = (peVar3->name)._M_dataplus._M_p;
    local_218._0_8_ = pVVar13;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_218,pcVar4,pcVar4 + (peVar3->name)._M_string_length);
    iVar11 = std::__cxx11::string::compare(local_218);
    if ((Value *)local_218._0_8_ != pVVar13) {
      operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
    }
    if (iVar11 != 0) {
      peVar3 = (this->method).super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      pcVar4 = (peVar3->name)._M_dataplus._M_p;
      local_218._0_8_ = pVVar13;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_218,pcVar4,pcVar4 + (peVar3->name)._M_string_length);
      iVar11 = std::__cxx11::string::compare(local_218);
      if ((Value *)local_218._0_8_ != pVVar13) {
        operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
      }
      if (iVar11 == 0) {
        local_218._0_8_ = pVVar13;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"capitalize method","");
        local_238._0_8_ = (Value *)0x0;
        local_238._8_8_ = (Value *)0x0;
        local_f8._0_8_ = (string *)0x0;
        local_f8._8_8_ = (string *)0x0;
        ArgumentsValue::expectArgs
                  (&local_178,(string *)local_218,(pair<unsigned_long,_unsigned_long> *)local_238,
                   (pair<unsigned_long,_unsigned_long> *)local_f8);
        if ((Value *)local_218._0_8_ != pVVar13) {
          operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
        }
        capitalize((string *)local_218,(string *)local_148);
        Value::Value(__return_storage_ptr__,(string *)local_218);
      }
      else {
        peVar3 = (this->method).super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        pcVar4 = (peVar3->name)._M_dataplus._M_p;
        local_218._0_8_ = pVVar13;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_218,pcVar4,pcVar4 + (peVar3->name)._M_string_length);
        iVar11 = std::__cxx11::string::compare(local_218);
        if ((Value *)local_218._0_8_ != pVVar13) {
          operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
        }
        if (iVar11 == 0) {
          local_218._0_8_ = pVVar13;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"endswith method","");
          local_238._0_8_ = (pointer)0x1;
          local_238._8_8_ = (Value *)0x1;
          local_f8._0_8_ = (string *)0x0;
          local_f8._8_8_ = (string *)0x0;
          ArgumentsValue::expectArgs
                    (&local_178,(string *)local_218,(pair<unsigned_long,_unsigned_long> *)local_238,
                     (pair<unsigned_long,_unsigned_long> *)local_f8);
          if ((Value *)local_218._0_8_ != pVVar13) {
            operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
          }
          Value::get<std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218,
                     local_178.args.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>.
                     _M_impl.super__Vector_impl_data._M_start);
          if ((ulong)local_148._8_8_ < (ulong)local_218._8_8_) {
LAB_001ee159:
            bVar9 = false;
          }
          else {
            bVar9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_ ==
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            if (!bVar9) {
              if (((pointer)(local_218._0_8_ + -1))[local_218._8_8_] ==
                  ((pointer)(local_148._0_8_ + -1))[local_148._8_8_]) {
                lVar20 = 0;
                do {
                  bVar9 = 1 - local_218._8_8_ == lVar20;
                  if (bVar9) goto LAB_001ee15b;
                  lVar7 = lVar20 + -2;
                  lVar6 = lVar20 + -2;
                  lVar20 = lVar20 + -1;
                } while (((pointer)((long)(_func_int ***)local_218._8_8_ + local_218._0_8_))[lVar7]
                         == ((pointer)((long)(_func_int ***)local_148._8_8_ + local_148._0_8_))
                            [lVar6]);
              }
              goto LAB_001ee159;
            }
          }
LAB_001ee15b:
          local_238[0] = bVar9;
          Value::Value(__return_storage_ptr__,(bool *)local_238);
        }
        else {
          peVar3 = (this->method).
                   super___shared_ptr<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          pcVar4 = (peVar3->name)._M_dataplus._M_p;
          local_218._0_8_ = pVVar13;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_218,pcVar4,pcVar4 + (peVar3->name)._M_string_length);
          iVar11 = std::__cxx11::string::compare(local_218);
          if ((Value *)local_218._0_8_ != pVVar13) {
            operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
          }
          if (iVar11 != 0) {
            if ((element_type *)local_148._0_8_ != (element_type *)(local_148 + 0x10)) {
              operator_delete((void *)local_148._0_8_,(ulong)(local_148._16_8_ + 1));
            }
            goto LAB_001ee374;
          }
          local_218._0_8_ = pVVar13;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"title method","");
          local_238._0_8_ = (Value *)0x0;
          local_238._8_8_ = (Value *)0x0;
          local_f8._0_8_ = (string *)0x0;
          local_f8._8_8_ = (string *)0x0;
          ArgumentsValue::expectArgs
                    (&local_178,(string *)local_218,(pair<unsigned_long,_unsigned_long> *)local_238,
                     (pair<unsigned_long,_unsigned_long> *)local_f8);
          if ((Value *)local_218._0_8_ != pVVar13) {
            operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
          }
          local_218._0_8_ = pVVar13;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_218,local_148._0_8_,
                     (pointer)((long)(_func_int ***)local_148._8_8_ + local_148._0_8_));
          uVar8 = local_218._8_8_;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            do {
              pVVar14 = (Value *)local_218._0_8_;
              if ((p_Var19 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
                 (iVar11 = isspace((int)((pointer)(local_218._0_8_ + -1))[(long)p_Var19]),
                 iVar11 != 0)) {
                pVVar14 = (Value *)local_218._0_8_;
                iVar11 = toupper((int)*(char *)(local_218._0_8_ + (long)p_Var19));
                uVar10 = (undefined1)iVar11;
              }
              else {
                iVar11 = tolower((int)*(char *)((long)pVVar14 + (long)p_Var19));
                uVar10 = (undefined1)iVar11;
              }
              *(undefined1 *)
               ((long)&(pVVar14->super_enable_shared_from_this<minja::Value>)._M_weak_this.
                       super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
               (long)p_Var19) = uVar10;
              p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        ((long)&p_Var19->_vptr__Sp_counted_base + 1);
            } while ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8 != p_Var19);
          }
          Value::Value(__return_storage_ptr__,(string *)local_218);
        }
      }
      goto LAB_001ee040;
    }
    local_218._0_8_ = pVVar13;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"split method","");
    local_238._0_8_ = (Value *)0x1;
    local_238._8_8_ = (Value *)0x1;
    local_f8._0_8_ = (string *)0x0;
    local_f8._8_8_ = (string *)0x0;
    ArgumentsValue::expectArgs
              (&local_178,(string *)local_218,(pair<unsigned_long,_unsigned_long> *)local_238,
               (pair<unsigned_long,_unsigned_long> *)local_f8);
    if ((Value *)local_218._0_8_ != pVVar13) {
      operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
    }
    Value::get<std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238,
               local_178.args.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>.
               _M_impl.super__Vector_impl_data._M_start);
    split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_f8,(string *)local_148,(string *)local_238);
    local_68.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.super__Vector_base<minja::Value,_std::allocator<minja::Value>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Value::array(__return_storage_ptr__,&local_68);
    std::vector<minja::Value,_std::allocator<minja::Value>_>::~vector(&local_68);
    uVar8 = local_f8._8_8_;
    if (local_f8._0_8_ != local_f8._8_8_) {
      v = (string *)local_f8._0_8_;
      do {
        Value::Value((Value *)local_218,v);
        Value::push_back(__return_storage_ptr__,(Value *)local_218);
        nlohmann::json_abi_v3_11_3::
        basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::assert_invariant((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            *)&local_1d8,false);
        nlohmann::json_abi_v3_11_3::
        basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_1d8);
        if (_Stack_1e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1e0._M_pi);
        }
        if (_Stack_1f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1f0._M_pi);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._24_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._24_8_);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var1 = (_Atomic_word *)(local_218._8_8_ + 0xc);
            iVar11 = *p_Var1;
            *p_Var1 = *p_Var1 + -1;
            UNLOCK();
          }
          else {
            iVar11 = *(_Atomic_word *)(local_218._8_8_ + 0xc);
            *(int *)(local_218._8_8_ + 0xc) = iVar11 + -1;
          }
          if (iVar11 == 1) {
            (*(*(_func_int ***)local_218._8_8_)[3])();
          }
        }
        v = v + 1;
      } while (v != (string *)uVar8);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_f8);
    pVVar14 = (Value *)local_238._0_8_;
    if ((Value *)local_238._0_8_ != (Value *)(local_238 + 0x10)) goto LAB_001ee04f;
  }
  if ((element_type *)local_148._0_8_ != (element_type *)(local_148 + 0x10)) {
    operator_delete((void *)local_148._0_8_,(ulong)(local_148._16_8_ + 1));
  }
LAB_001ed1de:
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_minja::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_minja::Value>_>_>
  ::~vector(&local_178.kwargs);
  std::vector<minja::Value,_std::allocator<minja::Value>_>::~vector(&local_178.args);
  nlohmann::json_abi_v3_11_3::
  basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::assert_invariant(&local_d8.primitive_,false);
  nlohmann::json_abi_v3_11_3::
  basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data(&local_d8.primitive_.m_data);
  if (local_d8.callable_.
      super___shared_ptr<std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d8.callable_.
               super___shared_ptr<std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_d8.object_.
      super___shared_ptr<nlohmann::json_abi_v3_11_3::ordered_map<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value,_std::less<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d8.object_.
               super___shared_ptr<nlohmann::json_abi_v3_11_3::ordered_map<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value,_std::less<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_d8.array_.
      super___shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d8.array_.
               super___shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_d8.super_enable_shared_from_this<minja::Value>._M_weak_this.
      super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_d8.super_enable_shared_from_this<minja::Value>._M_weak_this.
                 super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _M_weak_count;
      iVar11 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar11 = (local_d8.super_enable_shared_from_this<minja::Value>._M_weak_this.
                super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               _M_weak_count;
      (local_d8.super_enable_shared_from_this<minja::Value>._M_weak_this.
       super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_weak_count
           = iVar11 + -1;
    }
    if (iVar11 == 1) {
      (*(local_d8.super_enable_shared_from_this<minja::Value>._M_weak_this.
         super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base[3])();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Value do_evaluate(const std::shared_ptr<Context> & context) const override {
        if (!object) throw std::runtime_error("MethodCallExpr.object is null");
        if (!method) throw std::runtime_error("MethodCallExpr.method is null");
        auto obj = object->evaluate(context);
        auto vargs = args.evaluate(context);
        if (obj.is_null()) {
          throw std::runtime_error("Trying to call method '" + method->get_name() + "' on null");
        }
        if (obj.is_array()) {
          if (method->get_name() == "append") {
              vargs.expectArgs("append method", {1, 1}, {0, 0});
              obj.push_back(vargs.args[0]);
              return Value();
          } else if (method->get_name() == "pop") {
              vargs.expectArgs("pop method", {0, 1}, {0, 0});
              return obj.pop(vargs.args.empty() ? Value() : vargs.args[0]);
          } else if (method->get_name() == "insert") {
              vargs.expectArgs("insert method", {2, 2}, {0, 0});
              auto index = vargs.args[0].get<int64_t>();
              if (index < 0 || index > (int64_t) obj.size()) throw std::runtime_error("Index out of range for insert method");
              obj.insert(index, vargs.args[1]);
              return Value();
          }
        } else if (obj.is_object()) {
          if (method->get_name() == "items") {
            vargs.expectArgs("items method", {0, 0}, {0, 0});
            auto result = Value::array();
            for (const auto& key : obj.keys()) {
              result.push_back(Value::array({key, obj.at(key)}));
            }
            return result;
          } else if (method->get_name() == "pop") {
            vargs.expectArgs("pop method", {1, 1}, {0, 0});
            return obj.pop(vargs.args[0]);
          } else if (method->get_name() == "get") {
            vargs.expectArgs("get method", {1, 2}, {0, 0});
            auto key = vargs.args[0];
            if (vargs.args.size() == 1) {
              return obj.contains(key) ? obj.at(key) : Value();
            } else {
              return obj.contains(key) ? obj.at(key) : vargs.args[1];
            }
          } else if (obj.contains(method->get_name())) {
            auto callable = obj.at(method->get_name());
            if (!callable.is_callable()) {
              throw std::runtime_error("Property '" + method->get_name() + "' is not callable");
            }
            return callable.call(context, vargs);
          }
        } else if (obj.is_string()) {
          auto str = obj.get<std::string>();
          if (method->get_name() == "strip") {
            vargs.expectArgs("strip method", {0, 1}, {0, 0});
            auto chars = vargs.args.empty() ? "" : vargs.args[0].get<std::string>();
            return Value(strip(str, chars));
          } else if (method->get_name() == "lstrip") {
            vargs.expectArgs("lstrip method", {0, 1}, {0, 0});
            auto chars = vargs.args.empty() ? "" : vargs.args[0].get<std::string>();
            return Value(strip(str, chars, /* left= */ true, /* right= */ false));
          } else if (method->get_name() == "rstrip") {
            vargs.expectArgs("rstrip method", {0, 1}, {0, 0});
            auto chars = vargs.args.empty() ? "" : vargs.args[0].get<std::string>();
            return Value(strip(str, chars, /* left= */ false, /* right= */ true));
          } else if (method->get_name() == "split") {
            vargs.expectArgs("split method", {1, 1}, {0, 0});
            auto sep = vargs.args[0].get<std::string>();
            auto parts = split(str, sep);
            Value result = Value::array();
            for (const auto& part : parts) {
              result.push_back(Value(part));
            }
            return result;
          } else if (method->get_name() == "capitalize") {
            vargs.expectArgs("capitalize method", {0, 0}, {0, 0});
            return Value(capitalize(str));
          } else if (method->get_name() == "endswith") {
            vargs.expectArgs("endswith method", {1, 1}, {0, 0});
            auto suffix = vargs.args[0].get<std::string>();
            return suffix.length() <= str.length() && std::equal(suffix.rbegin(), suffix.rend(), str.rbegin());
          } else if (method->get_name() == "title") {
            vargs.expectArgs("title method", {0, 0}, {0, 0});
            auto res = str;
            for (size_t i = 0, n = res.size(); i < n; ++i) {
              if (i == 0 || std::isspace(res[i - 1])) res[i] = std::toupper(res[i]);
              else res[i] = std::tolower(res[i]);
            }
            return res;
          }
        }
        throw std::runtime_error("Unknown method: " + method->get_name());
    }